

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanInstance.cpp
# Opt level: O2

bool __thiscall
VulkanUtilities::VulkanInstance::IsLayerAvailable
          (VulkanInstance *this,char *LayerName,uint32_t *Version)

{
  pointer pVVar1;
  int iVar2;
  pointer __s1;
  
  __s1 = (this->m_Layers).super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>.
         _M_impl.super__Vector_impl_data._M_start;
  pVVar1 = (this->m_Layers).
           super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (__s1 == pVVar1) {
LAB_0025bfa2:
      return __s1 != pVVar1;
    }
    iVar2 = strcmp(__s1->layerName,LayerName);
    if (iVar2 == 0) {
      *Version = __s1->specVersion;
      goto LAB_0025bfa2;
    }
    __s1 = __s1 + 1;
  } while( true );
}

Assistant:

bool VulkanInstance::IsLayerAvailable(const char* LayerName, uint32_t& Version) const
{
    for (const auto& Layer : m_Layers)
    {
        if (strcmp(Layer.layerName, LayerName) == 0)
        {
            Version = Layer.specVersion;
            return true;
        }
    }
    return false;
}